

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O2

void ctr_transform(ptls_cipher_context_t *_ctx,void *output,void *input,size_t len)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  __m128i v;
  
  if ((len < 0x11) && (*(char *)&_ctx[0x11].do_init != '\0')) {
    *(undefined1 *)&_ctx[0x11].do_init = 0;
    uVar1 = *(uint *)&_ctx[0x11].algo;
    uVar2 = *(uint *)((long)&_ctx[0x11].algo + 4);
    uVar3 = *(uint *)&_ctx[0x11].do_dispose;
    uVar4 = *(uint *)((long)&_ctx[0x11].do_dispose + 4);
    if (len < 0x10) {
      uVar5 = uVar1;
      uVar6 = uVar2;
      uVar7 = uVar3;
      uVar8 = uVar4;
      loadn128(input,len);
      v[0]._0_4_ = uVar5 ^ uVar1;
      v[0]._4_4_ = uVar6 ^ uVar2;
      v[1]._0_4_ = uVar7 ^ uVar3;
      v[1]._4_4_ = uVar8 ^ uVar4;
      storen128(output,len,v);
      return;
    }
    uVar5 = *(uint *)((long)input + 4);
    uVar6 = *(uint *)((long)input + 8);
    uVar7 = *(uint *)((long)input + 0xc);
    *(uint *)output = uVar1 ^ *input;
    *(uint *)((long)output + 4) = uVar2 ^ uVar5;
    *(uint *)((long)output + 8) = uVar3 ^ uVar6;
    *(uint *)((long)output + 0xc) = uVar4 ^ uVar7;
    return;
  }
  __assert_fail("(ctx->is_ready && len <= 16) || !\"CTR transfomation is supported only once per call to `init` and the maximum size is limited  to 16 bytes\""
                ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/fusion.c"
                ,0x42d,"void ctr_transform(ptls_cipher_context_t *, void *, const void *, size_t)");
}

Assistant:

static void ctr_transform(ptls_cipher_context_t *_ctx, void *output, const void *input, size_t len)
{
    struct ctr_context *ctx = (struct ctr_context *)_ctx;

    assert((ctx->is_ready && len <= 16) ||
           !"CTR transfomation is supported only once per call to `init` and the maximum size is limited  to 16 bytes");
    ctx->is_ready = 0;

    if (len < 16) {
        storen128(output, len, _mm_xor_si128(_mm_loadu_si128(&ctx->bits), loadn128(input, len)));
    } else {
        _mm_storeu_si128(output, _mm_xor_si128(_mm_loadu_si128(&ctx->bits), _mm_loadu_si128(input)));
    }
}